

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void sgai_median_patch_values
               (Integer type,Integer ndim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,void *C_ptr,void *M_ptr,Integer offset)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  undefined4 uVar23;
  float fVar24;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar36;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  long local_e8 [7];
  void *local_b0;
  long local_a8 [7];
  long alStack_70 [8];
  
  lVar18 = 1;
  for (lVar11 = 1; lVar11 < ndim; lVar11 = lVar11 + 1) {
    lVar18 = lVar18 * ((hiA[lVar11] - loA[lVar11]) + 1);
  }
  local_e8[0] = 0;
  local_e8[1] = 0;
  alStack_70[1] = 1;
  alStack_70[2] = 1;
  local_a8[0] = *ldA;
  local_a8[1] = *ldA * ldA[1];
  for (lVar11 = 2; lVar11 < ndim; lVar11 = lVar11 + 1) {
    local_e8[lVar11] = 0;
    alStack_70[lVar11 + 1] = ((hiA[lVar11 + -1] - loA[lVar11 + -1]) + 1) * alStack_70[lVar11];
    local_a8[lVar11] = ldA[lVar11] * local_a8[lVar11 + -1];
  }
  switch(type) {
  case 0x3e9:
    lVar11 = 0;
    if (lVar18 < 1) {
      lVar18 = lVar11;
    }
    local_b0 = (void *)((long)A_ptr + offset * 4);
    while (lVar11 != lVar18) {
      lVar11 = lVar11 + 1;
      lVar16 = 0;
      for (lVar19 = 1; lVar19 < ndim; lVar19 = lVar19 + 1) {
        lVar16 = lVar16 + local_a8[lVar19 + -1] * local_e8[lVar19];
        lVar17 = local_e8[lVar19] + (ulong)(lVar11 % alStack_70[lVar19 + 1] == 0);
        lVar20 = 0;
        if (lVar17 <= hiA[lVar19] - loA[lVar19]) {
          lVar20 = lVar17;
        }
        local_e8[lVar19] = lVar20;
      }
      lVar19 = *hiA;
      lVar20 = *loA;
      for (lVar17 = 0; lVar17 <= lVar19 - lVar20; lVar17 = lVar17 + 1) {
        iVar6 = *(int *)((long)local_b0 + lVar17 * 4 + lVar16 * 4);
        iVar7 = *(int *)((long)B_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4);
        iVar15 = iVar6;
        if (iVar6 != iVar7) {
          iVar8 = *(int *)((long)C_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4);
          if (iVar6 < iVar7) {
            if ((iVar6 <= iVar8) && (iVar15 = iVar7, iVar8 < iVar7)) {
              iVar15 = iVar8;
            }
          }
          else if ((iVar6 <= iVar7) || (iVar15 = iVar7, iVar7 <= iVar8)) {
            iVar10 = iVar6;
            if (iVar8 < iVar6) {
              iVar10 = iVar8;
            }
            iVar15 = iVar6;
            if (iVar7 <= iVar8) {
              iVar15 = iVar10;
            }
          }
        }
        *(int *)((long)M_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4) = iVar15;
      }
    }
    break;
  case 0x3ea:
    lVar11 = 0;
    if (lVar18 < 1) {
      lVar18 = lVar11;
    }
    while (lVar11 != lVar18) {
      lVar11 = lVar11 + 1;
      lVar19 = 0;
      for (lVar16 = 1; lVar16 < ndim; lVar16 = lVar16 + 1) {
        lVar19 = lVar19 + local_a8[lVar16 + -1] * local_e8[lVar16];
        lVar17 = local_e8[lVar16] + (ulong)(lVar11 % alStack_70[lVar16 + 1] == 0);
        lVar20 = 0;
        if (lVar17 <= hiA[lVar16] - loA[lVar16]) {
          lVar20 = lVar17;
        }
        local_e8[lVar16] = lVar20;
      }
      for (lVar16 = 0; lVar16 <= *hiA - *loA; lVar16 = lVar16 + 1) {
        lVar20 = *(long *)((long)A_ptr + lVar16 * 8 + lVar19 * 8 + offset * 8);
        lVar17 = *(long *)((long)B_ptr + lVar16 * 8 + lVar19 * 8 + offset * 8);
        lVar12 = lVar20;
        if (lVar20 != lVar17) {
          lVar9 = *(long *)((long)C_ptr + lVar16 * 8 + lVar19 * 8 + offset * 8);
          if (lVar20 < lVar17) {
            if ((lVar20 <= lVar9) && (lVar12 = lVar17, lVar9 < lVar17)) {
              lVar12 = lVar9;
            }
          }
          else if ((lVar20 <= lVar17) || (lVar12 = lVar17, lVar17 <= lVar9)) {
            lVar21 = lVar20;
            if (lVar9 < lVar20) {
              lVar21 = lVar9;
            }
            lVar12 = lVar20;
            if (lVar17 <= lVar9) {
              lVar12 = lVar21;
            }
          }
        }
        *(long *)((long)M_ptr + lVar16 * 8 + lVar19 * 8 + offset * 8) = lVar12;
      }
    }
    break;
  case 0x3eb:
    lVar11 = 0;
    if (lVar18 < 1) {
      lVar18 = lVar11;
    }
    while (lVar11 != lVar18) {
      lVar11 = lVar11 + 1;
      lVar16 = 0;
      for (lVar19 = 1; lVar19 < ndim; lVar19 = lVar19 + 1) {
        lVar16 = lVar16 + local_a8[lVar19 + -1] * local_e8[lVar19];
        lVar17 = local_e8[lVar19] + (ulong)(lVar11 % alStack_70[lVar19 + 1] == 0);
        lVar20 = 0;
        if (lVar17 <= hiA[lVar19] - loA[lVar19]) {
          lVar20 = lVar17;
        }
        local_e8[lVar19] = lVar20;
      }
      lVar19 = *hiA;
      lVar20 = *loA;
      for (lVar17 = 0; lVar17 <= lVar19 - lVar20; lVar17 = lVar17 + 1) {
        fVar24 = *(float *)((long)A_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4);
        fVar26 = *(float *)((long)B_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4);
        if ((fVar24 != fVar26) || (NAN(fVar24) || NAN(fVar26))) {
          fVar22 = *(float *)((long)C_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4);
          if (fVar26 <= fVar24) {
            if ((fVar24 <= fVar26) || (fVar26 <= fVar22)) {
              if ((fVar26 <= fVar22) && (fVar22 <= fVar24)) goto LAB_0012a2c0;
              goto LAB_0012a2bd;
            }
LAB_0012a2f0:
            fVar22 = fVar26;
          }
          else {
            if (fVar22 < fVar24) goto LAB_0012a2bd;
            if ((fVar22 < fVar24) || (fVar26 < fVar22)) goto LAB_0012a2f0;
          }
        }
        else {
LAB_0012a2bd:
          fVar22 = fVar24;
        }
LAB_0012a2c0:
        *(float *)((long)M_ptr + lVar17 * 4 + lVar16 * 4 + offset * 4) = fVar22;
      }
    }
    break;
  case 0x3ec:
    lVar11 = 0;
    if (lVar18 < 1) {
      lVar18 = lVar11;
    }
    while (lVar11 != lVar18) {
      lVar11 = lVar11 + 1;
      lVar16 = 0;
      for (lVar19 = 1; lVar19 < ndim; lVar19 = lVar19 + 1) {
        lVar16 = lVar16 + local_a8[lVar19 + -1] * local_e8[lVar19];
        lVar17 = local_e8[lVar19] + (ulong)(lVar11 % alStack_70[lVar19 + 1] == 0);
        lVar20 = 0;
        if (lVar17 <= hiA[lVar19] - loA[lVar19]) {
          lVar20 = lVar17;
        }
        local_e8[lVar19] = lVar20;
      }
      lVar19 = *hiA;
      lVar20 = *loA;
      for (lVar17 = 0; lVar17 <= lVar19 - lVar20; lVar17 = lVar17 + 1) {
        dVar31 = *(double *)((long)A_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8);
        dVar30 = *(double *)((long)B_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8);
        if ((dVar31 != dVar30) || (NAN(dVar31) || NAN(dVar30))) {
          dVar36 = *(double *)((long)C_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8);
          uVar23 = SUB84(dVar36,0);
          uVar25 = (undefined4)((ulong)dVar36 >> 0x20);
          if (dVar30 <= dVar31) {
            if ((dVar31 <= dVar30) || (dVar30 <= dVar36)) {
              if ((dVar30 <= dVar36) && (dVar36 <= dVar31)) goto LAB_0012a60d;
              goto LAB_0012a609;
            }
LAB_0012a643:
            uVar23 = SUB84(dVar30,0);
            uVar25 = (undefined4)((ulong)dVar30 >> 0x20);
          }
          else {
            if (dVar36 < dVar31) goto LAB_0012a609;
            if ((dVar36 < dVar31) || (dVar30 < dVar36)) goto LAB_0012a643;
          }
        }
        else {
LAB_0012a609:
          uVar23 = SUB84(dVar31,0);
          uVar25 = (undefined4)((ulong)dVar31 >> 0x20);
        }
LAB_0012a60d:
        *(ulong *)((long)M_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8) = CONCAT44(uVar25,uVar23);
      }
    }
    break;
  default:
    pnga_error("median: wrong data type",type);
    return;
  case 0x3ee:
    lVar11 = 0;
    if (lVar18 < 1) {
      lVar18 = lVar11;
    }
    while (lVar11 != lVar18) {
      lVar11 = lVar11 + 1;
      lVar16 = 0;
      for (lVar19 = 1; lVar19 < ndim; lVar19 = lVar19 + 1) {
        lVar16 = lVar16 + local_a8[lVar19 + -1] * local_e8[lVar19];
        lVar17 = local_e8[lVar19] + (ulong)(lVar11 % alStack_70[lVar19 + 1] == 0);
        lVar20 = 0;
        if (lVar17 <= hiA[lVar19] - loA[lVar19]) {
          lVar20 = lVar17;
        }
        local_e8[lVar19] = lVar20;
      }
      lVar19 = *hiA;
      lVar20 = *loA;
      for (lVar17 = 0; lVar17 <= lVar19 - lVar20; lVar17 = lVar17 + 1) {
        uVar2 = *(undefined8 *)((long)A_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8);
        uVar3 = *(undefined8 *)((long)B_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8);
        uVar4 = *(undefined8 *)((long)C_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8);
        fVar24 = (float)uVar4;
        fVar26 = (float)((ulong)uVar4 >> 0x20);
        fVar28 = (float)uVar3;
        fVar29 = (float)((ulong)uVar3 >> 0x20);
        auVar32._4_4_ = fVar29 * fVar29;
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._4_4_;
        auVar32._12_4_ = auVar32._4_4_;
        auVar33._8_8_ = auVar32._8_8_;
        auVar33._0_8_ = (double)(fVar28 * fVar28 + auVar32._4_4_);
        fVar22 = (float)uVar2;
        fVar27 = (float)((ulong)uVar2 >> 0x20);
        dVar31 = (double)(fVar24 * fVar24 + fVar26 * fVar26);
        dVar30 = SQRT(auVar33._0_8_);
        auVar5._8_4_ = SUB84(dVar31,0);
        auVar5._0_8_ = (double)(fVar22 * fVar22 + fVar27 * fVar27);
        auVar5._12_4_ = (int)((ulong)dVar31 >> 0x20);
        auVar34 = sqrtpd(auVar33,auVar5);
        dVar31 = auVar34._0_8_;
        if ((dVar31 != dVar30) || (NAN(dVar31) || NAN(dVar30))) {
          dVar36 = auVar34._8_8_;
          if (dVar30 <= dVar31) {
            if (((dVar31 <= dVar30) || (fVar39 = fVar28, fVar40 = fVar29, dVar30 <= dVar36)) &&
               ((dVar36 < dVar30 || (fVar39 = fVar24, fVar40 = fVar26, dVar31 < dVar36))))
            goto LAB_0012a74e;
          }
          else {
            fVar39 = fVar22;
            fVar40 = fVar27;
            if (dVar31 <= dVar36) {
              auVar35._8_8_ = -(ulong)(dVar30 < dVar36);
              auVar35._0_8_ = -(ulong)(dVar36 < dVar31);
              uVar13 = movmskpd((int)ldA,auVar35);
              ldA = (Integer *)(ulong)uVar13;
              fVar39 = fVar24;
              fVar40 = fVar26;
              if (uVar13 != 0) {
                fVar39 = fVar28;
                fVar40 = fVar29;
              }
            }
          }
        }
        else {
LAB_0012a74e:
          fVar39 = fVar22;
          fVar40 = fVar27;
        }
        *(ulong *)((long)M_ptr + lVar17 * 8 + lVar16 * 8 + offset * 8) = CONCAT44(fVar40,fVar39);
      }
    }
    break;
  case 0x3ef:
    lVar11 = 0;
    if (lVar18 < 1) {
      lVar18 = lVar11;
    }
    while (lVar11 != lVar18) {
      lVar11 = lVar11 + 1;
      lVar16 = 0;
      for (uVar14 = 1; (long)uVar14 < ndim; uVar14 = uVar14 + 1) {
        lVar16 = lVar16 + local_a8[uVar14 - 1] * local_e8[uVar14];
        lVar20 = local_e8[uVar14] + (ulong)(lVar11 % alStack_70[uVar14 + 1] == 0);
        lVar19 = 0;
        if (lVar20 <= hiA[uVar14] - loA[uVar14]) {
          lVar19 = lVar20;
        }
        local_e8[uVar14] = lVar19;
      }
      lVar19 = *hiA;
      lVar20 = *loA;
      lVar17 = lVar16 * 0x10 + offset * 0x10;
      for (lVar16 = 0; lVar16 <= lVar19 - lVar20; lVar16 = lVar16 + 1) {
        auVar34 = *(undefined1 (*) [16])((long)A_ptr + lVar17);
        auVar5 = *(undefined1 (*) [16])((long)B_ptr + lVar17);
        auVar32 = *(undefined1 (*) [16])((long)C_ptr + lVar17);
        dVar30 = SQRT(auVar5._0_8_ * auVar5._0_8_ + auVar5._8_8_ * auVar5._8_8_);
        auVar37._0_8_ = auVar34._8_8_ * auVar34._8_8_;
        auVar37._8_8_ = auVar32._8_8_ * auVar32._8_8_;
        dVar31 = auVar32._0_8_ * auVar32._0_8_ + auVar37._8_8_;
        auVar38._8_4_ = SUB84(dVar31,0);
        auVar38._0_8_ = auVar34._0_8_ * auVar34._0_8_ + auVar37._0_8_;
        auVar38._12_4_ = (int)((ulong)dVar31 >> 0x20);
        auVar38 = sqrtpd(auVar37,auVar38);
        dVar31 = auVar38._0_8_;
        if ((dVar31 != dVar30) || (NAN(dVar31) || NAN(dVar30))) {
          dVar36 = auVar38._8_8_;
          if (dVar30 <= dVar31) {
            if (((dVar31 <= dVar30) ||
                (uVar23 = auVar5._0_4_, uVar25 = auVar5._4_4_, uVar41 = auVar5._8_4_,
                uVar42 = auVar5._12_4_, dVar30 <= dVar36)) &&
               ((dVar36 < dVar30 ||
                (uVar23 = auVar32._0_4_, uVar25 = auVar32._4_4_, uVar41 = auVar32._8_4_,
                uVar42 = auVar32._12_4_, dVar31 < dVar36)))) goto LAB_0012a3d7;
          }
          else {
            uVar23 = auVar34._0_4_;
            uVar25 = auVar34._4_4_;
            uVar41 = auVar34._8_4_;
            uVar42 = auVar34._12_4_;
            if (dVar31 <= dVar36) {
              auVar34._8_8_ = -(ulong)(dVar30 < dVar36);
              auVar34._0_8_ = -(ulong)(dVar36 < dVar31);
              uVar13 = movmskpd((int)uVar14,auVar34);
              uVar14 = (ulong)uVar13;
              uVar23 = auVar32._0_4_;
              uVar25 = auVar32._4_4_;
              uVar41 = auVar32._8_4_;
              uVar42 = auVar32._12_4_;
              if (uVar13 != 0) {
                uVar23 = auVar5._0_4_;
                uVar25 = auVar5._4_4_;
                uVar41 = auVar5._8_4_;
                uVar42 = auVar5._12_4_;
              }
            }
          }
        }
        else {
LAB_0012a3d7:
          uVar23 = auVar34._0_4_;
          uVar25 = auVar34._4_4_;
          uVar41 = auVar34._8_4_;
          uVar42 = auVar34._12_4_;
        }
        puVar1 = (undefined4 *)((long)M_ptr + lVar17);
        *puVar1 = uVar23;
        puVar1[1] = uVar25;
        puVar1[2] = uVar41;
        puVar1[3] = uVar42;
        lVar17 = lVar17 + 0x10;
      }
    }
  }
  return;
}

Assistant:

static void sgai_median_patch_values(Integer type, Integer ndim, Integer *loA,
                              Integer *hiA, Integer *ldA, void *A_ptr,
                              void *B_ptr, void *C_ptr, void *M_ptr,
                              Integer offset)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;

  double na, nb, nc;            /*norm of a, norm of b, norm of c */
  int ia, ib, ic, im;
  float fa, fb, fc, fm;
  double da, db, dc, dm;
  long la, lb, lc, lm;
  DoubleComplex za, zb, zc, zm;
  SingleComplex ca, cb, cc, cm;

  /* number of n-element of the first dimension */
  n1dim = 1;
  for (i = 1; i < ndim; i++)
    n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0;
  bvalue[1] = 0;
  bunit[0] = 1;
  bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0];
  baseldA[1] = baseldA[0] * ldA[1];
  for (i = 2; i < ndim; i++)
  {
    bvalue[i] = 0;
    bunit[i] = bunit[i - 1] * (hiA[i - 1] - loA[i - 1] + 1);
    baseldA[i] = baseldA[i - 1] * ldA[i];
  }
  switch(type) {
    case C_DBL:
      A_ptr = (void*)((double*)(A_ptr) + offset);
      B_ptr = (void*)((double*)(B_ptr) + offset);
      C_ptr = (void*)((double*)(C_ptr) + offset);
      M_ptr = (void*)((double*)(M_ptr) + offset);
      break;
    case C_INT:
      A_ptr = (void*)((int*)(A_ptr) + offset);
      B_ptr = (void*)((int*)(B_ptr) + offset);
      C_ptr = (void*)((int*)(C_ptr) + offset);
      M_ptr = (void*)((int*)(M_ptr) + offset);
      break;
    case C_DCPL:
      A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((DoubleComplex*)(M_ptr) + offset);
      break;
    case C_SCPL:
      A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((SingleComplex*)(M_ptr) + offset);
      break;
    case C_FLOAT:
      A_ptr = (void*)((float*)(A_ptr) + offset);
      B_ptr = (void*)((float*)(B_ptr) + offset);
      C_ptr = (void*)((float*)(C_ptr) + offset);
      M_ptr = (void*)((float*)(M_ptr) + offset);
      break;
    case C_LONG:
      A_ptr = (void*)((long*)(A_ptr) + offset);
      B_ptr = (void*)((long*)(B_ptr) + offset);
      C_ptr = (void*)((long*)(C_ptr) + offset);
      M_ptr = (void*)((long*)(M_ptr) + offset);
      break;
    case C_LONGLONG:
      A_ptr = (void*)((long long*)(A_ptr) + offset);
      B_ptr = (void*)((long long*)(B_ptr) + offset);
      C_ptr = (void*)((long long*)(C_ptr) + offset);
      M_ptr = (void*)((long long*)(M_ptr) + offset);
      break;
    default:
      break;
  }

  /*compute elementwise median */

  switch (type) {

    case C_INT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ia = ((int *) A_ptr)[idx + j];
          ib = ((int *) B_ptr)[idx + j];
          ic = ((int *) C_ptr)[idx + j];
          median(ia, ib, ic, im);
          ((int *) M_ptr)[idx + j] = im;
        }
      }
      break;
    case C_LONG: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          la = ((long *) A_ptr)[idx + j];
          lb = ((long *) B_ptr)[idx + j];
          lc = ((long *) C_ptr)[idx + j];
          median(la, lb, lc, lm);
          ((long *) M_ptr)[idx + j] = lm;
        }
      }
      break;
    case C_FLOAT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          fa = ((float *) A_ptr)[idx + j];
          fb = ((float *) B_ptr)[idx + j];
          fc = ((float *) C_ptr)[idx + j];
          median(fa, fb, fc, fm);
          ((float *) M_ptr)[idx + j] = fm;
        }
      }
      break;
    case C_DBL: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          da = ((double *) A_ptr)[idx + j];
          db = ((double *) B_ptr)[idx + j];
          dc = ((double *) C_ptr)[idx + j];
          median(da, db, dc, dm);
          ((double *) M_ptr)[idx + j] = dm;
        }
      }
      break;
    case C_DCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          za = ((DoubleComplex *) A_ptr)[idx + j];
          zb = ((DoubleComplex *) B_ptr)[idx + j];
          zc = ((DoubleComplex *) C_ptr)[idx + j];
          na = sqrt ((za.real) * (za.real) + (za.imag) * (za.imag));
          nb = sqrt ((zb.real) * (zb.real) + (zb.imag) * (zb.imag));
          nc = sqrt ((zc.real) * (zc.real) + (zc.imag) * (zc.imag));
          median_dcpl(na, nb, nc, za, zb, zc, zm);
          ((DoubleComplex *) M_ptr)[idx + j] = zm;
        }
      }
      break;

    case C_SCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ca = ((SingleComplex *) A_ptr)[idx + j];
          cb = ((SingleComplex *) B_ptr)[idx + j];
          cc = ((SingleComplex *) C_ptr)[idx + j];
          na = sqrt ((ca.real) * (ca.real) + (ca.imag) * (ca.imag));
          nb = sqrt ((cb.real) * (cb.real) + (cb.imag) * (cb.imag));
          nc = sqrt ((cc.real) * (cc.real) + (cc.imag) * (cc.imag));
          median_scpl(na, nb, nc, ca, cb, cc, cm);
          ((SingleComplex *) M_ptr)[idx + j] = cm;
        }
      }
      break;
    default:
      pnga_error("median: wrong data type", type);
  }
}